

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::mul(Simulator *this,PCode *code)

{
  deque<StackSymbol,_std::allocator<StackSymbol>_> *this_00;
  simulator_error *psVar1;
  _Elt_pointer pSVar2;
  double dVar3;
  StackSymbol second;
  StackSymbol first;
  int local_fc;
  undefined1 local_f8 [32];
  pointer local_d8;
  double local_d0;
  pointer local_c8;
  pointer pdStack_c0;
  pointer local_b8;
  Type local_b0;
  int local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  double local_88;
  vector<double,_std::allocator<double>_> local_80;
  Type local_68;
  int local_60;
  vector<int,_std::allocator<int>_> local_58;
  double local_40;
  vector<double,_std::allocator<double>_> local_38;
  
  pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  local_68 = pSVar2[-1].type_;
  local_60 = pSVar2[-1].value_.int_value;
  std::vector<int,_std::allocator<int>_>::vector(&local_58,&pSVar2[-1].value_.int_array);
  local_40 = pSVar2[-1].value_.real_value;
  std::vector<double,_std::allocator<double>_>::vector(&local_38,&pSVar2[-1].value_.real_array);
  this_00 = &this->stack_;
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  local_b0 = pSVar2[-1].type_;
  local_a8 = pSVar2[-1].value_.int_value;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,&pSVar2[-1].value_.int_array);
  local_88 = pSVar2[-1].value_.real_value;
  std::vector<double,_std::allocator<double>_>::vector(&local_80,&pSVar2[-1].value_.real_array);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  local_d0 = local_88;
  if (local_b0 != kReal) {
    if (local_b0 != kInt) {
      psVar1 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_fc = this->eip_;
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,anon_var_dwarf_af9c,anon_var_dwarf_af9c + 0x1b);
      simulator_error::simulator_error(psVar1,&local_fc,(string *)local_f8);
      __cxa_throw(psVar1,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    local_d0 = (double)local_a8;
  }
  dVar3 = local_40;
  if (local_68 != kReal) {
    if (local_68 != kInt) {
      psVar1 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_fc = this->eip_;
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,anon_var_dwarf_af9c,anon_var_dwarf_af9c + 0x1b);
      simulator_error::simulator_error(psVar1,&local_fc,(string *)local_f8);
      __cxa_throw(psVar1,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    dVar3 = (double)local_60;
  }
  local_d0 = local_d0 * dVar3;
  local_f8._0_4_ = kReal;
  local_f8._16_8_ = (pointer)0x0;
  local_f8._24_8_ = (pointer)0x0;
  local_d8 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  pdStack_c0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
            (this_00,(StackSymbol *)local_f8);
  if (local_c8 != (pointer)0x0) {
    operator_delete(local_c8);
  }
  if ((pointer)local_f8._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._16_8_);
  }
  this->eip_ = this->eip_ + 1;
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Simulator::mul(const PCode &code) {
    StackSymbol first = stack_.back();
    stack_.pop_back();
    StackSymbol second = stack_.back();
    stack_.pop_back();

    double result;
    if (second.type() == StackSymbol::Type::kInt) {
        result = second.int_value();
    } else if (second.type() == StackSymbol::Type::kReal) {
        result = second.real_value();
    } else {
        throw simulator_error(eip(), "不合法的乘法操作数");
    }
    if (first.type() == StackSymbol::Type::kInt) {
        result *= first.int_value();
    } else if (first.type() == StackSymbol::Type::kReal) {
        result *= first.real_value();
    } else {
        throw simulator_error(eip(), "不合法的乘法操作数");
    }

    stack_.push_back(StackSymbol(result));
    inc_eip();
}